

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

size_t __thiscall NULLCString::strlen(NULLCString *this,char *__s)

{
  uint local_2c;
  uint i;
  NULLCArray string_local;
  
  if (this == (NULLCString *)0x0) {
    nullcThrowError("string is null");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else {
    for (local_2c = 0; local_2c < (uint)__s; local_2c = local_2c + 1) {
      if (this[local_2c] == (NULLCString)0x0) {
        string_local.ptr._4_4_ = local_2c;
        goto LAB_001461e1;
      }
    }
    nullcThrowError("string is not null-terminated");
    string_local.ptr._4_4_ = 0xffffffff;
  }
LAB_001461e1:
  return (ulong)string_local.ptr._4_4_;
}

Assistant:

int strlen(NULLCArray string)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		for(unsigned i = 0; i < string.len; i++)
		{
			if(!string.ptr[i])
				return i;
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}